

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O2

tommy_trie_inplace_node *
trie_inplace_bucket_remove
          (tommy_uint_t shift,tommy_trie_inplace_node **let_ptr,tommy_trie_inplace_node *remove,
          tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node_struct *ptVar2;
  tommy_trie_inplace_node *ptVar3;
  ulong uVar4;
  tommy_trie_inplace_node *head;
  long lVar5;
  tommy_trie_inplace_node *ptVar6;
  byte bVar7;
  tommy_trie_inplace_node_struct **pptVar8;
  tommy_trie_inplace_node_struct *ptVar9;
  undefined4 in_register_0000003c;
  tommy_trie_inplace_node_struct *ptVar10;
  tommy_trie_inplace_node_struct *ptVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  
  ptVar10 = (tommy_trie_inplace_node_struct *)CONCAT44(in_register_0000003c,shift);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = 0x1a;
  do {
    ptVar6 = ptVar10->next;
    if (ptVar6 == (tommy_trie_inplace_node *)0x0) {
      let_ptr = (tommy_trie_inplace_node **)0x0;
LAB_0010ebb6:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (tommy_trie_inplace_node *)let_ptr;
      }
      __stack_chk_fail();
    }
    if (ptVar6->key == (uint)remove) {
      if (let_ptr == (tommy_trie_inplace_node **)0x0) {
        let_ptr = &ptVar6->next;
      }
      ptVar2 = ((tommy_trie_inplace_node *)let_ptr)->next;
      ptVar9 = ((tommy_trie_inplace_node *)let_ptr)->prev;
      ptVar11 = ptVar2;
      if (ptVar2 == (tommy_trie_inplace_node_struct *)0x0) {
        ptVar11 = ptVar6;
      }
      ptVar11->prev = ptVar9;
      if (ptVar6 == (tommy_trie_inplace_node *)let_ptr) {
        ptVar9 = ptVar10;
      }
      ptVar9->next = ptVar2;
      ptVar3 = ptVar10->next;
      if (ptVar3 != ptVar6) {
        if (ptVar3 == (tommy_trie_inplace_node *)0x0) {
          pptVar8 = (tommy_trie_inplace_node_struct **)0x0;
          ptVar6 = (tommy_trie_inplace_node *)let_ptr;
          do {
            uVar4 = 3;
            do {
              uVar12 = uVar4;
              if ((int)uVar12 < 0) {
                if (pptVar8 != (tommy_trie_inplace_node_struct **)0x0) {
                  *pptVar8 = (tommy_trie_inplace_node_struct *)0x0;
                  for (lVar5 = 4; lVar5 != 8; lVar5 = lVar5 + 1) {
                    ptVar6->map[lVar5 + -4] = ((tommy_trie_inplace_node *)let_ptr)->map[lVar5 + -4];
                  }
                  ptVar10->next = ptVar6;
                }
                goto LAB_0010ebb6;
              }
              uVar4 = (ulong)((int)uVar12 - 1);
            } while (ptVar6->map[uVar12] == (tommy_trie_inplace_node_struct *)0x0);
            pptVar8 = ptVar6->map + uVar12;
            ptVar6 = ptVar6->map[uVar12];
          } while( true );
        }
        for (lVar5 = 4; lVar5 != 8; lVar5 = lVar5 + 1) {
          ptVar3->map[lVar5 + -4] = ((tommy_trie_inplace_node *)let_ptr)->map[lVar5 + -4];
        }
      }
      goto LAB_0010ebb6;
    }
    ptVar10 = (tommy_trie_inplace_node_struct *)(ptVar6->map + ((uint)remove >> (bVar7 & 0x1f) & 3))
    ;
    bVar7 = bVar7 - 2;
  } while( true );
}

Assistant:

static tommy_trie_inplace_node* trie_inplace_bucket_remove(tommy_uint_t shift, tommy_trie_inplace_node** let_ptr, tommy_trie_inplace_node* remove, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	int i;
	tommy_trie_inplace_node** leaf_let_ptr;
	tommy_trie_inplace_node* leaf;

	node = *let_ptr;
	while (node && node->key != key) {
		let_ptr = &node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		node = *let_ptr;
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	if (!node)
		return 0;

	/* if the node to remove is not specified */
	if (!remove)
		remove = node; /* remove the first */

	tommy_trie_inplace_list_remove(let_ptr, remove);

	/* if not change in the node, nothing more to do */
	if (*let_ptr == node)
		return remove;

	/* if we have a substitute */
	if (*let_ptr != 0) {
		/* copy the child pointers to the new one */
		node = *let_ptr;
		for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
			node->map[i] = remove->map[i];

		return remove;
	}

	/* find a leaf */
	leaf_let_ptr = 0;
	leaf = remove;

	/* search backward, statistically we have more zeros than ones */
	i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
	while (i >= 0) {
		if (leaf->map[i]) {
			leaf_let_ptr = &leaf->map[i];
			leaf = *leaf_let_ptr;
			i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
			continue;
		}
		--i;
	}

	/* if it's itself a leaf */
	if (!leaf_let_ptr)
		return remove;

	/* remove the leaf */
	*leaf_let_ptr = 0;

	/* copy the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		leaf->map[i] = remove->map[i];

	/* put it in place */
	*let_ptr = leaf;

	return remove;
}